

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O2

int rtosc_arg_vals_cmp_has_next
              (rtosc_arg_val_itr *litr,rtosc_arg_val_itr *ritr,size_t lsize,size_t rsize)

{
  int32_t iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((litr->i < lsize) && (ritr->i < rsize)) {
    uVar2 = 1;
    if ((litr->av->type == '-') && (ritr->av->type == '-')) {
      iVar1 = rtosc_av_rep_num(litr->av);
      if (iVar1 == 0) {
        iVar1 = rtosc_av_rep_num(ritr->av);
        uVar2 = (uint)(iVar1 != 0);
      }
    }
  }
  return uVar2;
}

Assistant:

int rtosc_arg_vals_cmp_has_next(const rtosc_arg_val_itr* litr,
                                const rtosc_arg_val_itr* ritr,
                                size_t lsize, size_t rsize)
{
    return     (litr->i < lsize) && (ritr->i < rsize)
            && (litr->av->type != '-' || ritr->av->type != '-' ||
                rtosc_av_rep_num(litr->av) || rtosc_av_rep_num(ritr->av));
}